

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitSop.c
# Opt level: O1

int Kit_SopIsCubeFree(Kit_Sop_t *cSop)

{
  uint uVar1;
  long lVar2;
  
  if ((long)cSop->nCubes < 1) {
    return 0;
  }
  uVar1 = 0xffffffff;
  lVar2 = 0;
  do {
    if (cSop->pCubes[lVar2] == 0) break;
    uVar1 = uVar1 & cSop->pCubes[lVar2];
    lVar2 = lVar2 + 1;
  } while (cSop->nCubes != lVar2);
  return (int)(uVar1 == 0);
}

Assistant:

int Kit_SopIsCubeFree( Kit_Sop_t * cSop )
{
    return Kit_SopCommonCube( cSop ) == 0;
}